

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::
TestVector<CSHA512,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CSHA512 *h,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long uVar3;
  size_type sVar4;
  void *in_RSI;
  long in_FS_OFFSET;
  size_t len;
  size_t pos;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CSHA512 hasher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  CSHA512 *in_stack_fffffffffffffa88;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  CSHA512 *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  lazy_ostream *in_stack_fffffffffffffab8;
  ulong local_490;
  int local_488;
  lazy_ostream local_438 [2];
  assertion_result local_418;
  const_string local_3e0 [2];
  lazy_ostream local_3c0 [2];
  assertion_result local_3a0 [2];
  const_string local_368 [2];
  lazy_ostream local_348 [2];
  assertion_result local_328 [2];
  const_string local_2f0 [2];
  lazy_ostream local_2d0 [2];
  assertion_result local_2b0 [3];
  undefined1 local_260 [200];
  undefined1 local_198 [200];
  undefined1 local_d0 [200];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa78);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
               (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (unsigned_long)in_stack_fffffffffffffa78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffab8,
               (const_string *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               (size_t)in_stack_fffffffffffffaa8,
               (const_string *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa88,(bool)in_stack_fffffffffffffa87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
               (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (unsigned_long)in_stack_fffffffffffffa78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
               (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (unsigned_long)in_stack_fffffffffffffa78);
    in_stack_fffffffffffffa78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b0,local_2d0,local_2f0,0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffa78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa98,
             CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  memcpy(local_d0,in_RSI,200);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            (in_stack_fffffffffffffa78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_fffffffffffffa78);
  CSHA512::Write(in_stack_fffffffffffffa98,
                 (uchar *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                 (size_t)in_stack_fffffffffffffa88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa78);
  CSHA512::Finalize(in_stack_fffffffffffffa88,
                    (uchar *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
               (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (unsigned_long)in_stack_fffffffffffffa78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffab8,
               (const_string *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               (size_t)in_stack_fffffffffffffaa8,
               (const_string *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
    std::operator==(in_stack_fffffffffffffaa8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa88,(bool)in_stack_fffffffffffffa87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
               (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (unsigned_long)in_stack_fffffffffffffa78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
               (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (unsigned_long)in_stack_fffffffffffffa78);
    in_stack_fffffffffffffa78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_328,local_348,local_368,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffa78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_488 = 0; local_488 < 0x20; local_488 = local_488 + 1) {
    memcpy(local_198,in_RSI,200);
    local_490 = 0;
    while (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size(in_stack_fffffffffffffa78), local_490 < sVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_fffffffffffffa78);
      uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        ((RandomMixin<FastRandomContext> *)
                         CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                         (unsigned_long)in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                (in_stack_fffffffffffffa78);
      CSHA512::Write(in_stack_fffffffffffffa98,
                     (uchar *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                     (size_t)in_stack_fffffffffffffa88);
      local_490 = uVar3 + local_490;
      if (local_490 != 0) {
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffa78);
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(in_stack_fffffffffffffa78);
        if ((sVar2 < local_490 + sVar4 * 2) &&
           (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(in_stack_fffffffffffffa78), local_490 < sVar2)) {
          memcpy(local_260,local_198,200);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                    (in_stack_fffffffffffffa78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_fffffffffffffa78);
          CSHA512::Write(in_stack_fffffffffffffa98,
                         (uchar *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                         (size_t)in_stack_fffffffffffffa88);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffa78);
          CSHA512::Finalize(in_stack_fffffffffffffa88,
                            (uchar *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
                       (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (unsigned_long)in_stack_fffffffffffffa78);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffffa78);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_fffffffffffffab8,
                       (const_string *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0)
                       ,(size_t)in_stack_fffffffffffffaa8,
                       (const_string *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0)
                      );
            std::operator==(in_stack_fffffffffffffaa8,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_fffffffffffffa88,(bool)in_stack_fffffffffffffa87
                      );
            in_stack_fffffffffffffab8 = boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
                       (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (unsigned_long)in_stack_fffffffffffffa78);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffffa78);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
                       (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (unsigned_long)in_stack_fffffffffffffa78);
            in_stack_fffffffffffffa78 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_3a0,local_3c0,local_3e0,0x37,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffffa78);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffffa78);
            in_stack_fffffffffffffab7 = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_fffffffffffffab7);
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa78);
    CSHA512::Finalize(in_stack_fffffffffffffa88,
                      (uchar *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
    do {
      in_stack_fffffffffffffaa8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
                 (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (unsigned_long)in_stack_fffffffffffffa78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffab8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                 (size_t)in_stack_fffffffffffffaa8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
      in_stack_fffffffffffffaa7 =
           std::operator==(in_stack_fffffffffffffaa8,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffa88,(bool)in_stack_fffffffffffffa87);
      in_stack_fffffffffffffa98 = (CSHA512 *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
                 (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (unsigned_long)in_stack_fffffffffffffa78);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffa78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa88,
                 (pointer)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                 (unsigned_long)in_stack_fffffffffffffa78);
      in_stack_fffffffffffffa78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_418,local_438,(const_string *)&stack0xfffffffffffffba8,0x3b,CHECK,CHECK_PRED
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffa78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa78);
      in_stack_fffffffffffffa97 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffa97);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}